

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__gif_parse_colortable(stbi__context *s,stbi_uc (*pal) [4],int num_entries,int transp)

{
  stbi_uc sVar1;
  stbi_uc *psVar2;
  ulong uVar3;
  
  if (0 < num_entries) {
    uVar3 = 0;
    do {
      psVar2 = s->img_buffer;
      if (psVar2 < s->img_buffer_end) {
LAB_001432e5:
        s->img_buffer = psVar2 + 1;
        sVar1 = *psVar2;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          psVar2 = s->img_buffer;
          goto LAB_001432e5;
        }
        sVar1 = '\0';
      }
      pal[uVar3][2] = sVar1;
      psVar2 = s->img_buffer;
      if (psVar2 < s->img_buffer_end) {
LAB_0014331d:
        s->img_buffer = psVar2 + 1;
        sVar1 = *psVar2;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          psVar2 = s->img_buffer;
          goto LAB_0014331d;
        }
        sVar1 = '\0';
      }
      pal[uVar3][1] = sVar1;
      psVar2 = s->img_buffer;
      if (psVar2 < s->img_buffer_end) {
LAB_00143355:
        s->img_buffer = psVar2 + 1;
        sVar1 = *psVar2;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          psVar2 = s->img_buffer;
          goto LAB_00143355;
        }
        sVar1 = '\0';
      }
      pal[uVar3][0] = sVar1;
      pal[uVar3][3] = -((uint)transp != uVar3);
      uVar3 = uVar3 + 1;
    } while ((uint)num_entries != uVar3);
  }
  return;
}

Assistant:

static void stbi__gif_parse_colortable(stbi__context *s, stbi_uc pal[256][4], int num_entries, int transp)
{
   int i;
   for (i=0; i < num_entries; ++i) {
      pal[i][2] = stbi__get8(s);
      pal[i][1] = stbi__get8(s);
      pal[i][0] = stbi__get8(s);
      pal[i][3] = transp == i ? 0 : 255;
   }
}